

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<13,_0,_9,_0,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Vec4 *local_b0;
  undefined8 local_a8;
  float local_a0 [5];
  Matrix<float,_3,_3> local_8c;
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_38;
  
  pfVar1 = (float *)&local_38;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[2] = 0.0;
  local_38.m_data.m_data[2].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[2] = 0.0;
  puVar2 = &s_constInMat3;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  pfVar1 = (float *)&local_68;
  local_68.m_data.m_data[1].m_data[1] = 0.0;
  local_68.m_data.m_data[1].m_data[2] = 0.0;
  local_68.m_data.m_data[2].m_data[0] = 0.0;
  local_68.m_data.m_data[2].m_data[1] = 0.0;
  local_68.m_data.m_data[0].m_data[0] = 0.0;
  local_68.m_data.m_data[0].m_data[1] = 0.0;
  local_68.m_data.m_data[0].m_data[2] = 0.0;
  local_68.m_data.m_data[1].m_data[0] = 0.0;
  local_68.m_data.m_data[2].m_data[2] = 0.0;
  puVar2 = &DAT_02292a54;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 3);
  tcu::operator*(&local_8c,&local_38,&local_68);
  local_a8 = (ulong)local_a8._4_4_ << 0x20;
  local_b0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_b0 + lVar3 * 4) =
         local_8c.m_data.m_data[0].m_data[lVar3] + local_8c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3 + 2] =
         *(float *)((long)&local_b0 + lVar3 * 4) +
         *(float *)((long)(local_68.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar3 * 4)] = local_a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}